

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  long lVar1;
  bool bVar2;
  Token local_b8;
  string local_90 [8];
  string data;
  allocator local_59;
  string local_58 [32];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_38;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  string *arg_local;
  size_t sStack_20;
  char c_local;
  size_t i_local;
  Parser *this_local;
  
  bVar2 = true;
  local_38 = tokens;
  tokens_local = (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                  *)arg;
  arg_local._7_1_ = c;
  sStack_20 = i;
  i_local = (size_t)this;
  if ((this->inQuotes & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"",3,&local_59);
    lVar1 = std::__cxx11::string::find((char)local_58,(ulong)(uint)(int)arg_local._7_1_);
    bVar2 = lVar1 == -1;
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  if (bVar2) {
    this_local._4_4_ = this->mode;
  }
  else {
    std::__cxx11::string::substr((ulong)local_90,(ulong)tokens_local);
    this_00 = local_38;
    Token::Token(&local_b8,Positional,local_90);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    push_back(this_00,&local_b8);
    Token::~Token(&local_b8);
    this_local._4_4_ = None;
    std::__cxx11::string::~string((string *)local_90);
  }
  return this_local._4_4_;
}

Assistant:

Mode handlePositional( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( inQuotes || std::string( "\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string data = arg.substr( from, i-from );
            tokens.push_back( Token( Token::Positional, data ) );
            return None;
        }